

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderUtil.cpp
# Opt level: O3

char * glu::getShaderTypeName(ShaderType shaderType)

{
  return _ZZN3glu17getShaderTypeNameENS_10ShaderTypeEE7s_names_rel +
         *(int *)(_ZZN3glu17getShaderTypeNameENS_10ShaderTypeEE7s_names_rel +
                 (long)(int)shaderType * 4);
}

Assistant:

const char* getShaderTypeName (ShaderType shaderType)
{
	static const char* s_names[] =
	{
		"vertex",
		"fragment",
		"geometry",
		"tess_control",
		"tess_eval",
		"compute",
	};

	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(s_names) == SHADERTYPE_LAST);
	DE_ASSERT(deInBounds32((int)shaderType, 0, SHADERTYPE_LAST));
	return s_names[(int)shaderType];
}